

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

Image * __thiscall sf::Texture::copyToImage(Texture *this)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  reference pvVar2;
  int iVar3;
  Vector2<unsigned_int> *in_RSI;
  Image *in_RDI;
  uint i;
  int dstPitch;
  int srcPitch;
  Uint8 *dst;
  Uint8 *src;
  char *in_stack_00000070;
  vector<unsigned_char,_std::allocator<unsigned_char>_> allPixels;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  TextureSaver save;
  TransientContextLock lock;
  Image *image;
  undefined4 in_stack_ffffffffffffff30;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff34;
  allocator_type *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff4c;
  uint local_84;
  int local_7c;
  reference local_78;
  reference in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  Image *in_stack_ffffffffffffffa0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40 [2];
  
  if (in_RSI[2].x == 0) {
    Image::Image((Image *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  else {
    GlResource::TransientContextLock::TransientContextLock
              ((TransientContextLock *)in_stack_ffffffffffffff40);
    priv::TextureSaver::TextureSaver
              ((TextureSaver *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
              (ulong)(in_RSI->x * in_RSI->y * 4);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x163a39);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (this_00,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x163a5f);
    bVar1 = sf::operator==(in_RSI,in_RSI + 1);
    uVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
    if ((bVar1) && ((in_RSI[2].y & 0x1000000) == 0)) {
      glBindTexture(0xde1,in_RSI[2].x);
      priv::glCheckError((char *)allPixels.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                         allPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,in_stack_00000070);
      uVar5 = 0;
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_40,0);
      glGetTexImage(0xde1,uVar5,0x1908,0x1401,pvVar2);
      priv::glCheckError((char *)allPixels.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                         allPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,in_stack_00000070);
    }
    else {
      in_stack_ffffffffffffff40 = (allocator_type *)&stack0xffffffffffffff9f;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x163b9a);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (this_00,CONCAT44(uVar5,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x163bba);
      glBindTexture(0xde1,in_RSI[2].x);
      priv::glCheckError((char *)allPixels.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                         allPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,in_stack_00000070);
      in_stack_ffffffffffffff34 = 0;
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &stack0xffffffffffffffa0,0);
      glGetTexImage(0xde1,in_stack_ffffffffffffff34,0x1908,0x1401,pvVar2);
      priv::glCheckError((char *)allPixels.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                         allPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,in_stack_00000070);
      in_stack_ffffffffffffff90 =
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &stack0xffffffffffffffa0,0);
      local_78 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_40,0);
      local_7c = in_RSI[1].x * 4;
      iVar3 = in_RSI->x << 2;
      if ((in_RSI[2].y & 0x1000000) != 0) {
        in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + local_7c * (in_RSI->y - 1);
        local_7c = in_RSI[1].x * -4;
      }
      for (local_84 = 0; local_84 < in_RSI->y; local_84 = local_84 + 1) {
        memcpy(local_78,in_stack_ffffffffffffff90,(long)iVar3);
        in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + local_7c;
        local_78 = local_78 + iVar3;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff40)
      ;
    }
    Image::Image((Image *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    uVar4 = in_RSI->y;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_40,0);
    Image::create(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                  in_stack_ffffffffffffff90);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff40);
    priv::TextureSaver::~TextureSaver((TextureSaver *)CONCAT44(in_stack_ffffffffffffff34,uVar4));
    GlResource::TransientContextLock::~TransientContextLock
              ((TransientContextLock *)CONCAT44(in_stack_ffffffffffffff34,uVar4));
  }
  return in_RDI;
}

Assistant:

Image Texture::copyToImage() const
{
    // Easy case: empty texture
    if (!m_texture)
        return Image();

    TransientContextLock lock;

    // Make sure that the current texture binding will be preserved
    priv::TextureSaver save;

    // Create an array of pixels
    std::vector<Uint8> pixels(m_size.x * m_size.y * 4);

#ifdef SFML_OPENGL_ES

    // OpenGL ES doesn't have the glGetTexImage function, the only way to read
    // from a texture is to bind it to a FBO and use glReadPixels
    GLuint frameBuffer = 0;
    glCheck(GLEXT_glGenFramebuffers(1, &frameBuffer));
    if (frameBuffer)
    {
        GLint previousFrameBuffer;
        glCheck(glGetIntegerv(GLEXT_GL_FRAMEBUFFER_BINDING, &previousFrameBuffer));

        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, frameBuffer));
        glCheck(GLEXT_glFramebufferTexture2D(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0));
        glCheck(glReadPixels(0, 0, m_size.x, m_size.y, GL_RGBA, GL_UNSIGNED_BYTE, &pixels[0]));
        glCheck(GLEXT_glDeleteFramebuffers(1, &frameBuffer));

        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, previousFrameBuffer));
    }

#else

    if ((m_size == m_actualSize) && !m_pixelsFlipped)
    {
        // Texture is not padded nor flipped, we can use a direct copy
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_UNSIGNED_BYTE, &pixels[0]));
    }
    else
    {
        // Texture is either padded or flipped, we have to use a slower algorithm

        // All the pixels will first be copied to a temporary array
        std::vector<Uint8> allPixels(m_actualSize.x * m_actualSize.y * 4);
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_UNSIGNED_BYTE, &allPixels[0]));

        // Then we copy the useful pixels from the temporary array to the final one
        const Uint8* src = &allPixels[0];
        Uint8* dst = &pixels[0];
        int srcPitch = m_actualSize.x * 4;
        int dstPitch = m_size.x * 4;

        // Handle the case where source pixels are flipped vertically
        if (m_pixelsFlipped)
        {
            src += srcPitch * (m_size.y - 1);
            srcPitch = -srcPitch;
        }

        for (unsigned int i = 0; i < m_size.y; ++i)
        {
            std::memcpy(dst, src, dstPitch);
            src += srcPitch;
            dst += dstPitch;
        }
    }

#endif // SFML_OPENGL_ES

    // Create the image
    Image image;
    image.create(m_size.x, m_size.y, &pixels[0]);

    return image;
}